

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::BlockEventListControl::Event>::
emplaceRealloc<slang::ast::BlockEventListControl::Event>
          (SmallVectorBase<slang::ast::BlockEventListControl::Event> *this,pointer pos,Event *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined7 uVar5;
  pointer pEVar6;
  pointer pEVar7;
  size_type sVar8;
  pointer pEVar9;
  long lVar10;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar10 = (long)pos - (long)this->data_;
  pEVar6 = (pointer)detail::allocArray(capacity,0x10);
  uVar3 = *(undefined8 *)&args->isBegin;
  *(undefined8 *)((long)pEVar6 + lVar10) = args->target;
  ((undefined8 *)((long)pEVar6 + lVar10))[1] = uVar3;
  pEVar7 = this->data_;
  sVar8 = this->len;
  if (pEVar7 + sVar8 == pos) {
    pEVar9 = pEVar6;
    if (sVar8 != 0) {
      do {
        bVar4 = pEVar7->isBegin;
        uVar5 = *(undefined7 *)&pEVar7->field_0x9;
        pEVar9->target = pEVar7->target;
        pEVar9->isBegin = bVar4;
        *(undefined7 *)&pEVar9->field_0x9 = uVar5;
        pEVar7 = pEVar7 + 1;
        pEVar9 = pEVar9 + 1;
      } while (pEVar7 != pos);
    }
  }
  else {
    pEVar9 = pEVar6;
    if (pEVar7 != pos) {
      do {
        bVar4 = pEVar7->isBegin;
        uVar5 = *(undefined7 *)&pEVar7->field_0x9;
        pEVar9->target = pEVar7->target;
        pEVar9->isBegin = bVar4;
        *(undefined7 *)&pEVar9->field_0x9 = uVar5;
        pEVar7 = pEVar7 + 1;
        pEVar9 = pEVar9 + 1;
      } while (pEVar7 != pos);
      pEVar7 = this->data_;
      sVar8 = this->len;
    }
    if (pEVar7 + sVar8 != pos) {
      puVar2 = (undefined8 *)((long)pEVar6 + lVar10);
      do {
        uVar3 = *(undefined8 *)&pos->isBegin;
        puVar2[2] = pos->target;
        puVar2[3] = uVar3;
        pos = pos + 1;
        puVar2 = puVar2 + 2;
      } while (pos != pEVar7 + sVar8);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pEVar6;
  return (pointer)((long)pEVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}